

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O3

int mbedtls_pk_verify_ext
              (mbedtls_pk_type_t type,void *options,mbedtls_pk_context *ctx,mbedtls_md_type_t md_alg
              ,uchar *hash,size_t hash_len,uchar *sig,size_t sig_len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  iVar2 = -16000;
  if ((ctx != (mbedtls_pk_context *)0x0) && (ctx->pk_info != (mbedtls_pk_info_t *)0x0)) {
    iVar1 = (*ctx->pk_info->can_do)(type);
    if (iVar1 == 0) {
      iVar2 = -0x3f00;
    }
    else if (type == MBEDTLS_PK_RSASSA_PSS) {
      if (options != (void *)0x0) {
        if ((ctx->pk_info != (mbedtls_pk_info_t *)0x0) &&
           (sVar3 = (*ctx->pk_info->get_bitlen)(ctx->pk_ctx), sig_len < sVar3 + 7 >> 3)) {
          return -0x4380;
        }
        iVar2 = mbedtls_rsa_rsassa_pss_verify_ext
                          ((mbedtls_rsa_context *)ctx->pk_ctx,
                           (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,0,md_alg,
                           (uint)hash_len,hash,*options,*(int *)((long)options + 4),sig);
        if (iVar2 == 0) {
          iVar2 = 0;
          if (ctx->pk_info == (mbedtls_pk_info_t *)0x0) {
            uVar4 = 0;
          }
          else {
            sVar3 = (*ctx->pk_info->get_bitlen)(ctx->pk_ctx);
            uVar4 = sVar3 + 7 >> 3;
          }
          if (uVar4 < sig_len) {
            iVar2 = -0x3900;
          }
        }
      }
    }
    else if (options == (void *)0x0) {
      iVar2 = mbedtls_pk_verify(ctx,md_alg,hash,hash_len,sig,sig_len);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_pk_verify_ext( mbedtls_pk_type_t type, const void *options,
                   mbedtls_pk_context *ctx, mbedtls_md_type_t md_alg,
                   const unsigned char *hash, size_t hash_len,
                   const unsigned char *sig, size_t sig_len )
{
    if( ctx == NULL || ctx->pk_info == NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    if( ! mbedtls_pk_can_do( ctx, type ) )
        return( MBEDTLS_ERR_PK_TYPE_MISMATCH );

    if( type == MBEDTLS_PK_RSASSA_PSS )
    {
#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_PKCS1_V21)
        int ret;
        const mbedtls_pk_rsassa_pss_options *pss_opts;

        if( options == NULL )
            return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

        pss_opts = (const mbedtls_pk_rsassa_pss_options *) options;

        if( sig_len < mbedtls_pk_get_len( ctx ) )
            return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

        ret = mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_pk_rsa( *ctx ),
                NULL, NULL, MBEDTLS_RSA_PUBLIC,
                md_alg, (unsigned int) hash_len, hash,
                pss_opts->mgf1_hash_id,
                pss_opts->expected_salt_len,
                sig );
        if( ret != 0 )
            return( ret );

        if( sig_len > mbedtls_pk_get_len( ctx ) )
            return( MBEDTLS_ERR_PK_SIG_LEN_MISMATCH );

        return( 0 );
#else
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );
#endif
    }

    /* General case: no options */
    if( options != NULL )
        return( MBEDTLS_ERR_PK_BAD_INPUT_DATA );

    return( mbedtls_pk_verify( ctx, md_alg, hash, hash_len, sig, sig_len ) );
}